

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptContext.cpp
# Opt level: O0

bool __thiscall Js::ScriptContext::Close(ScriptContext *this,bool inDestructor)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  ThreadContext *this_00;
  JavascriptLibrary *this_01;
  Recycler *this_02;
  bool inDestructor_local;
  ScriptContext *this_local;
  
  if ((this->isScriptContextActuallyClosed & 1U) == 0) {
    InternalClose(this);
    if ((!inDestructor) && ((this->super_ScriptContextBase).globalObject != (GlobalObject *)0x0)) {
      bVar2 = IsClosedNativeCodeGenerator(this);
      if (!bVar2) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar3 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ScriptContext.cpp"
                                    ,0x344,"(this->IsClosedNativeCodeGenerator())",
                                    "this->IsClosedNativeCodeGenerator()");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar3 = 0;
      }
      this_00 = GetThreadContext(this);
      bVar2 = ThreadContext::IsJSRT(this_00);
      if (!bVar2) {
        this_01 = GetLibrary(this);
        bVar2 = JavascriptLibraryBase::IsChakraEngine(&this_01->super_JavascriptLibraryBase);
        if (!bVar2) {
          this_02 = GetRecycler(this);
          Memory::Recycler::RootRelease
                    (this_02,(this->super_ScriptContextBase).globalObject,(uint *)0x0);
        }
      }
      (this->super_ScriptContextBase).globalObject = (GlobalObject *)0x0;
    }
    ThreadContext::SetForceOneIdleCollection(this->threadContext);
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool ScriptContext::Close(bool inDestructor)
    {
        if (isScriptContextActuallyClosed)
        {
            return false;
        }

        InternalClose();

        if (!inDestructor && globalObject != nullptr)
        {
            //A side effect of releasing globalObject that this script context could be deleted, so the release call here
            //must be the last thing in close.
#if ENABLE_NATIVE_CODEGEN
            Assert(this->IsClosedNativeCodeGenerator());
#endif
            if (!GetThreadContext()->IsJSRT() && !GetLibrary()->IsChakraEngine())
            {
                GetRecycler()->RootRelease(globalObject);
            }
            globalObject = nullptr;
        }

        // A script context closing is a signal to the thread context that it
        // needs to do an idle GC independent of what the heuristics are
        this->threadContext->SetForceOneIdleCollection();

        return true;
    }